

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  *done = false;
  *(byte *)((long)&pcVar1->proto + 0x112) = *(byte *)((long)&pcVar1->proto + 0x112) & 0xdf;
  if ((*(uint *)&(data->state).field_0x74c >> 6 & 1) == 0) {
    data_local._4_4_ = ftp_parse_url_path(data);
  }
  else {
    data_local._4_4_ = wc_statemach(data);
    if ((data->wildcard->state == '\x05') || (data->wildcard->state == '\a')) {
      return CURLE_OK;
    }
  }
  if (data_local._4_4_ == CURLE_OK) {
    data_local._4_4_ = ftp_regular_transfer(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}